

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  long lVar1;
  
  if (-1 < pCur->iPage) {
    if (pCur->iPage != '\0') {
      lVar1 = 0;
      do {
        sqlite3PagerUnrefNotNull(pCur->apPage[lVar1]->pDbPage);
        lVar1 = lVar1 + 1;
      } while (lVar1 < pCur->iPage);
    }
    sqlite3PagerUnrefNotNull(pCur->pPage->pDbPage);
    pCur->iPage = -1;
  }
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  if( pCur->iPage>=0 ){
    for(i=0; i<pCur->iPage; i++){
      releasePageNotNull(pCur->apPage[i]);
    }
    releasePageNotNull(pCur->pPage);
    pCur->iPage = -1;
  }
}